

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

char * __thiscall cmMakefile::GetDefinition(cmMakefile *this,string *name)

{
  cmake *pcVar1;
  cmVariableWatch *this_00;
  bool bVar2;
  char *pcVar3;
  
  pcVar3 = cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
  if (pcVar3 == (char *)0x0) {
    pcVar3 = cmState::GetInitializedCacheValue(this->GlobalGenerator->CMakeInstance->State,name);
  }
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  if (((pcVar1 != (cmake *)0x0) &&
      (this_00 = pcVar1->VariableWatch, this_00 != (cmVariableWatch *)0x0)) &&
     (this->SuppressWatches == false)) {
    bVar2 = cmVariableWatch::VariableAccessed
                      (this_00,name,(uint)(pcVar3 == (char *)0x0),pcVar3,this);
    if (bVar2) {
      pcVar3 = cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
      if (pcVar3 == (char *)0x0) {
        pcVar3 = cmState::GetInitializedCacheValue(this->GlobalGenerator->CMakeInstance->State,name)
        ;
        return pcVar3;
      }
    }
  }
  return pcVar3;
}

Assistant:

const char* cmMakefile::GetDefinition(const std::string& name) const
{
  const char* def = this->StateSnapshot.GetDefinition(name);
  if (!def) {
    def = this->GetState()->GetInitializedCacheValue(name);
  }
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if (vv && !this->SuppressWatches) {
    bool const watch_function_executed = vv->VariableAccessed(
      name, def ? cmVariableWatch::VARIABLE_READ_ACCESS
                : cmVariableWatch::UNKNOWN_VARIABLE_READ_ACCESS,
      def, this);

    if (watch_function_executed) {
      // A callback was executed and may have caused re-allocation of the
      // variable storage.  Look it up again for now.
      // FIXME: Refactor variable storage to avoid this problem.
      def = this->StateSnapshot.GetDefinition(name);
      if (!def) {
        def = this->GetState()->GetInitializedCacheValue(name);
      }
    }
  }
#endif
  return def;
}